

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void av1_tpl_rdmult_setup(AV1_COMP *cpi)

{
  int stride;
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  long *in_RDI;
  int index;
  double rk;
  int64_t mc_dep_delta;
  TplDepStats *this_stats;
  int mi_col;
  int mi_row;
  double mc_dep_cost;
  double intra_cost;
  int col;
  int row;
  int step;
  double c;
  int num_rows;
  int num_cols;
  int num_mi_h;
  int num_mi_w;
  int block_size;
  int mi_cols_sr;
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  TplParams *tpl_data;
  int tpl_idx;
  AV1_COMMON *cm;
  int local_80;
  int local_7c;
  double local_78;
  double local_70;
  int local_64;
  int local_60;
  
  lVar2 = *in_RDI;
  pcVar8 = (char *)(*(long *)(lVar2 + 0x12298) + (long)(int)(uint)*(byte *)(in_RDI + 0xe258) * 0x60)
  ;
  if (*pcVar8 != '\0') {
    lVar3 = *(long *)(pcVar8 + 8);
    stride = *(int *)(pcVar8 + 0x40);
    iVar4 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
    iVar5 = (iVar4 + 3) / 4;
    iVar1 = *(int *)((long)in_RDI + 0x3c194);
    iVar6 = 1 << (*(byte *)(lVar2 + 0xd2ac) & 0x1f);
    for (local_60 = 0; local_60 < (iVar1 + 3) / 4; local_60 = local_60 + 1) {
      for (local_64 = 0; local_64 < iVar5; local_64 = local_64 + 1) {
        local_70 = 0.0;
        local_78 = 0.0;
        for (local_7c = local_60 << 2; local_7c < (local_60 + 1) * 4; local_7c = iVar6 + local_7c) {
          for (local_80 = local_64 << 2; local_80 < (local_64 + 1) * 4; local_80 = iVar6 + local_80)
          {
            if ((local_7c < *(int *)((long)in_RDI + 0x3c194)) && (local_80 < iVar4)) {
              iVar7 = av1_tpl_ptr_pos(local_7c,local_80,stride,*(uint8_t *)(lVar2 + 0xd2ac));
              lVar9 = lVar3 + (long)iVar7 * 200;
              local_70 = (double)(*(long *)(lVar9 + 0x18) << 7) + local_70;
              local_78 = (double)(*(long *)(lVar9 + 0x18) << 7) +
                         (double)((*(long *)(lVar9 + 0x40) * (long)*(int *)(pcVar8 + 0x54) + 0x100
                                  >> 9) + *(long *)(lVar9 + 0x48) * 0x80) + local_78;
            }
          }
        }
        *(double *)(in_RDI[0x8549] + (long)(local_60 * iVar5 + local_64) * 8) =
             (local_70 / local_78) / (double)in_RDI[0xc054] + 1.2;
      }
    }
  }
  return;
}

Assistant:

void av1_tpl_rdmult_setup(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const int tpl_idx = cpi->gf_frame_index;

  assert(
      IMPLIES(cpi->ppi->gf_group.size > 0, tpl_idx < cpi->ppi->gf_group.size));

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const TplDepFrame *const tpl_frame = &tpl_data->tpl_frame[tpl_idx];

  if (!tpl_frame->is_valid) return;

  const TplDepStats *const tpl_stats = tpl_frame->tpl_stats_ptr;
  const int tpl_stride = tpl_frame->stride;
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  const int block_size = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_cols_sr + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const double c = 1.2;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  // Loop through each 'block_size' X 'block_size' block.
  for (int row = 0; row < num_rows; row++) {
    for (int col = 0; col < num_cols; col++) {
      double intra_cost = 0.0, mc_dep_cost = 0.0;
      // Loop through each mi block.
      for (int mi_row = row * num_mi_h; mi_row < (row + 1) * num_mi_h;
           mi_row += step) {
        for (int mi_col = col * num_mi_w; mi_col < (col + 1) * num_mi_w;
             mi_col += step) {
          if (mi_row >= cm->mi_params.mi_rows || mi_col >= mi_cols_sr) continue;
          const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
              mi_row, mi_col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
          int64_t mc_dep_delta =
              RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                     this_stats->mc_dep_dist);
          intra_cost += (double)(this_stats->recrf_dist << RDDIV_BITS);
          mc_dep_cost +=
              (double)(this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
        }
      }
      const double rk = intra_cost / mc_dep_cost;
      const int index = row * num_cols + col;
      cpi->tpl_rdmult_scaling_factors[index] = rk / cpi->rd.r0 + c;
    }
  }
}